

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict type_qual_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  node_t_conflict n;
  node_t_conflict op;
  node_t_conflict r;
  node_t_conflict list;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  n = new_node(c2m_ctx,N_LIST);
  do {
    op = type_qual(c2m_ctx,no_err_p);
    if (op == &err_struct) {
      return &err_struct;
    }
    op_append(c2m_ctx,n,op);
  } while (((((short)*(undefined4 *)ppVar1->curr_token == 0x11e) ||
            ((short)*(undefined4 *)ppVar1->curr_token == 0x12e)) ||
           ((short)*(undefined4 *)ppVar1->curr_token == 0x13b)) ||
          ((short)*(undefined4 *)ppVar1->curr_token == 0x114));
  return n;
}

Assistant:

D (type_qual_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, r;

  list = new_node (c2m_ctx, N_LIST);
  for (;;) {
    P (type_qual);
    op_append (c2m_ctx, list, r);
    if (!C (T_CONST) && !C (T_RESTRICT) && !C (T_VOLATILE) && !C (T_ATOMIC)) break;
  }
  return list;
}